

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c6560e::ReportCheckResult
          (anon_unknown_dwarf_c6560e *this,string_view what,string *result,cmMakefile *mf)

{
  string_view view;
  undefined8 this_00;
  bool bVar1;
  cmake *pcVar2;
  cmMessenger *this_01;
  undefined1 local_1a8 [16];
  string_view local_198;
  anon_unknown_dwarf_c6560e *local_188;
  _Map_pointer ppvStack_180;
  cmAlphaNum local_178;
  string_view local_148;
  _Base_ptr local_138;
  _Base_ptr p_Stack_130;
  cmAlphaNum local_128;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> text;
  cmMakefile *mf_local;
  string *result_local;
  string_view what_local;
  
  text.field_2._8_8_ = result;
  pcVar2 = cmMakefile::GetCMakeInstance((cmMakefile *)result);
  bVar1 = cmake::HasCheckInProgress(pcVar2);
  if (bVar1) {
    pcVar2 = cmMakefile::GetCMakeInstance((cmMakefile *)text.field_2._8_8_);
    cmake::GetTopCheckInProgressMessage_abi_cxx11_(&local_88,pcVar2);
    std::operator+(&local_68,&local_88," - ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)what._M_str)
    ;
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    this_00 = text.field_2._8_8_;
    std::__cxx11::string::string((string *)&local_d8,(string *)local_48);
    IndentText(&local_b8,&local_d8,(cmMakefile *)text.field_2._8_8_);
    cmMakefile::DisplayStatus((cmMakefile *)this_00,&local_b8,-1.0);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    this_01 = cmMakefile::GetMessenger((cmMakefile *)text.field_2._8_8_);
    local_148 = (string_view)::cm::operator____s("Ignored ",8);
    local_138 = (_Base_ptr)local_148._M_len;
    p_Stack_130 = (_Base_ptr)local_148._M_str;
    cmAlphaNum::cmAlphaNum(&local_128,local_148);
    view._M_str = (char *)what._M_len;
    view._M_len = (size_t)this;
    local_188 = this;
    ppvStack_180 = (_Map_pointer)what._M_len;
    cmAlphaNum::cmAlphaNum(&local_178,view);
    local_198 = (string_view)::cm::operator____s(" without CHECK_START",0x14);
    cmStrCat<cm::static_string_view>
              (&local_f8,&local_128,&local_178,(static_string_view *)&local_198);
    cmMakefile::GetBacktrace((cmMakefile *)local_1a8);
    cmMessenger::DisplayMessage(this_01,AUTHOR_WARNING,&local_f8,(cmListFileBacktrace *)local_1a8);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  return;
}

Assistant:

void ReportCheckResult(cm::string_view what, std::string result,
                       cmMakefile& mf)
{
  if (mf.GetCMakeInstance()->HasCheckInProgress()) {
    auto text = mf.GetCMakeInstance()->GetTopCheckInProgressMessage() + " - " +
      std::move(result);
    mf.DisplayStatus(IndentText(std::move(text), mf), -1);
  } else {
    mf.GetMessenger()->DisplayMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat("Ignored "_s, what, " without CHECK_START"_s),
      mf.GetBacktrace());
  }
}